

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_flyweight.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  User *usr;
  long lVar2;
  pointer usr_00;
  initializer_list<User> __l;
  allocator_type local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  allocator<char> local_1d0;
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  vector<User,_std::allocator<User>_> users;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  User local_70 [4];
  User local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"John",&local_1c9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Doe",&local_1ca);
  User::User(local_70,&local_90,&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Mark",&local_1cb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Doe",&local_1cc);
  User::User(local_70 + 1,&local_d0,&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Jane",&local_1cd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Doe",&local_1ce);
  User::User(local_70 + 2,&local_110,&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Mike",&local_1cf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Doe",&local_1d0);
  User::User(local_70 + 3,&local_150,&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Jill",&local_1d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Doe",&local_1d2);
  User::User(&local_30,&local_190,&local_1b0);
  __l._M_len = 5;
  __l._M_array = local_70;
  std::vector<User,_std::allocator<User>_>::vector(&users,__l,&local_1d3);
  lVar2 = 0x40;
  do {
    User::~User((User *)((long)&local_70[0].m_first_name.h.h + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -0x10);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  for (usr_00 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_start;
      usr_00 != users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_finish; usr_00 = usr_00 + 1) {
    poVar1 = operator<<((ostream *)&std::cout,usr_00);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::vector<User,_std::allocator<User>_>::~vector(&users);
  return 0;
}

Assistant:

int main()
{
	std::vector<User> users{
		User{"John", "Doe"},
		User{"Mark", "Doe"},
		User{"Jane", "Doe"},
		User{"Mike", "Doe"},
		User{"Jill", "Doe"},
	};

	for(const auto& usr : users)
	{
		std::cout << usr << std::endl;
	}

	return 0;
}